

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_connection.hpp
# Opt level: O0

void __thiscall cinatra::coro_http_connection::build_ws_handshake_head(coro_http_connection *this)

{
  string_view key;
  string_view key_00;
  string_view client_encoding_type;
  bool bVar1;
  const_pointer pvVar2;
  coro_http_request *in_RDI;
  string_view protocal_str;
  sha1_context ctx;
  char accept_key [29];
  uint8_t key_src [60];
  uint8_t sha1buf [20];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  allocator<char> *in_stack_fffffffffffffde8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffdf0;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  char *__s;
  sha1_context *ctx_00;
  basic_string_view<char,_std::char_traits<char>_> *__t;
  size_t in_stack_fffffffffffffe28;
  coro_http_connection **ppcVar4;
  char *in_stack_fffffffffffffe30;
  allocator<char> *paVar5;
  void *in_stack_fffffffffffffe38;
  sha1_context *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  content_encoding in_stack_fffffffffffffe4c;
  undefined8 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  status_type in_stack_fffffffffffffe5c;
  coro_http_response *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  coro_http_response *in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_179 [2];
  allocator<char> local_131 [33];
  sha1_context local_110;
  string_view local_98;
  char local_88 [32];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined4 local_30;
  basic_string_view<char,_std::char_traits<char>_> local_28 [2];
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
  key._M_str = in_stack_fffffffffffffe30;
  key._M_len = in_stack_fffffffffffffe28;
  local_98 = coro_http_request::get_header_value(in_RDI,key);
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_98);
  local_58 = *(undefined8 *)(pvVar2 + 0x10);
  local_68 = *(undefined8 *)pvVar2;
  uStack_60 = *(undefined8 *)(pvVar2 + 8);
  local_40 = 0x2d414335392d4144;
  uStack_38 = 0x3843443042413543;
  local_50 = 0x3541464145383532;
  uStack_48 = 0x37342d343139452d;
  local_30 = 0x31314235;
  ctx_00 = &local_110;
  init<void>(ctx_00);
  update<void>(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,(size_t)in_stack_fffffffffffffe30
              );
  __t = local_28;
  finish<void>((sha1_context *)in_stack_fffffffffffffe50,
               (void *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  code_utils::base64_encode(local_88,__t,0x14,0);
  ppcVar4 = &in_RDI[0x13].conn_;
  paVar5 = local_131;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,(char *)__t
             ,(allocator<char> *)ctx_00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
  client_encoding_type._M_str = (char *)in_stack_fffffffffffffe70;
  client_encoding_type._M_len = (size_t)in_stack_fffffffffffffe68;
  coro_http_response::set_status_and_content
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,(string *)in_stack_fffffffffffffe50
             ,in_stack_fffffffffffffe4c,client_encoding_type);
  std::__cxx11::string::~string(in_stack_fffffffffffffde0);
  std::allocator<char>::~allocator(local_131);
  this_00 = (basic_string_view<char,_std::char_traits<char>_> *)&in_RDI[0x13].conn_;
  __s = "Upgrade";
  coro_http_response::add_header<char_const*,char_const*>
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,(char *)in_stack_fffffffffffffe60);
  coro_http_response::add_header<char_const*,char_const*>
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,(char *)in_stack_fffffffffffffe60);
  pbVar3 = local_179;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(pbVar3,__s,(size_type)this_00,in_stack_fffffffffffffde8);
  coro_http_response::add_header<char_const*,std::__cxx11::string>
            (in_stack_fffffffffffffe60,
             (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe50);
  std::__cxx11::string::~string(in_stack_fffffffffffffde0);
  std::allocator<char>::~allocator((allocator<char> *)local_179);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (this_00,(char *)&in_RDI[0x12].conn_);
  key_00._M_str = (char *)paVar5;
  key_00._M_len = (size_t)ppcVar4;
  coro_http_request::get_header_value(in_RDI,key_00);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffe70);
  if (!bVar1) {
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffe3f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,__t,
               (allocator<char> *)ctx_00);
    coro_http_response::add_header<char_const*,std::__cxx11::string>
              (in_stack_fffffffffffffe60,
               (char *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe50);
    std::__cxx11::string::~string(pbVar3);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe3f);
  }
  return;
}

Assistant:

void build_ws_handshake_head() {
    uint8_t sha1buf[20], key_src[60];
    char accept_key[29];

    std::memcpy(key_src, request_.get_header_value("sec-websocket-key").data(),
                24);
    std::memcpy(key_src + 24, ws_guid, 36);
    sha1_context ctx;
    init(ctx);
    update(ctx, key_src, sizeof(key_src));
    finish(ctx, sha1buf);

    code_utils::base64_encode(accept_key, sha1buf, sizeof(sha1buf), 0);

    response_.set_status_and_content(status_type::switching_protocols, "");

    response_.add_header("Upgrade", "WebSocket");
    response_.add_header("Connection", "Upgrade");
    response_.add_header("Sec-WebSocket-Accept", std::string(accept_key, 28));
    auto protocal_str = request_.get_header_value("sec-websocket-protocol");
#ifdef CINATRA_ENABLE_GZIP
    if (is_client_ws_compressed_) {
      response_.add_header("Sec-WebSocket-Extensions",
                           "permessage-deflate; client_no_context_takeover");
    }
#endif
    if (!protocal_str.empty()) {
      response_.add_header("Sec-WebSocket-Protocol", std::string(protocal_str));
    }
  }